

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::put_bits(jpeg_encoder *this,uint bits,uint len)

{
  uint8 *puVar1;
  uint8 uVar2;
  int in_EDX;
  int in_ESI;
  uint uVar3;
  jpeg_encoder *in_RDI;
  uint8 c;
  
  uVar3 = in_EDX + in_RDI->m_bits_in;
  in_RDI->m_bits_in = uVar3;
  in_RDI->m_bit_buffer = in_ESI << (0x18U - (char)uVar3 & 0x1f) | in_RDI->m_bit_buffer;
  while (7 < in_RDI->m_bits_in) {
    uVar2 = (uint8)(in_RDI->m_bit_buffer >> 0x10);
    puVar1 = in_RDI->m_pOut_buf;
    in_RDI->m_pOut_buf = puVar1 + 1;
    *puVar1 = uVar2;
    uVar3 = in_RDI->m_out_buf_left - 1;
    in_RDI->m_out_buf_left = uVar3;
    if (uVar3 == 0) {
      flush_output_buffer(in_RDI);
    }
    if (uVar2 == 0xff) {
      puVar1 = in_RDI->m_pOut_buf;
      in_RDI->m_pOut_buf = puVar1 + 1;
      *puVar1 = '\0';
      uVar3 = in_RDI->m_out_buf_left - 1;
      in_RDI->m_out_buf_left = uVar3;
      if (uVar3 == 0) {
        flush_output_buffer(in_RDI);
      }
    }
    in_RDI->m_bit_buffer = in_RDI->m_bit_buffer << 8;
    in_RDI->m_bits_in = in_RDI->m_bits_in - 8;
  }
  return;
}

Assistant:

void jpeg_encoder::put_bits(uint bits, uint len) {
  m_bit_buffer |= ((uint32)bits << (24 - (m_bits_in += len)));
  while (m_bits_in >= 8) {
    uint8 c;
#define JPGE_PUT_BYTE(c)       \
  {                            \
    *m_pOut_buf++ = (c);       \
    if (--m_out_buf_left == 0) \
      flush_output_buffer();   \
  }
    JPGE_PUT_BYTE(c = (uint8)((m_bit_buffer >> 16) & 0xFF));
    if (c == 0xFF)
      JPGE_PUT_BYTE(0);
    m_bit_buffer <<= 8;
    m_bits_in -= 8;
  }
}